

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultPhoto.h
# Opt level: O2

void __thiscall TgBot::InlineQueryResultPhoto::InlineQueryResultPhoto(InlineQueryResultPhoto *this)

{
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultPhoto_002cf490;
  (this->photoUrl)._M_dataplus._M_p = (pointer)&(this->photoUrl).field_2;
  (this->photoUrl)._M_string_length = 0;
  (this->photoUrl).field_2._M_local_buf[0] = '\0';
  (this->thumbUrl)._M_dataplus._M_p = (pointer)&(this->thumbUrl).field_2;
  (this->thumbUrl)._M_string_length = 0;
  (this->thumbUrl).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  this->photoWidth = 0;
  this->photoHeight = 0;
  return;
}

Assistant:

InlineQueryResultPhoto() {
        this->type = TYPE;
        this->photoWidth = 0;
        this->photoHeight = 0;
    }